

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O3

int nni_listener_find(nni_listener **lp,uint32_t id)

{
  nni_listener *pnVar1;
  int iVar2;
  
  nni_mtx_lock(&listeners_lk);
  pnVar1 = (nni_listener *)nni_id_get(&listeners,(ulong)id);
  if (pnVar1 == (nni_listener *)0x0) {
    iVar2 = 0xc;
  }
  else {
    pnVar1->l_ref = pnVar1->l_ref + 1;
    *lp = pnVar1;
    iVar2 = 0;
  }
  nni_mtx_unlock(&listeners_lk);
  return iVar2;
}

Assistant:

int
nni_listener_find(nni_listener **lp, uint32_t id)
{
	nni_listener *l;

	nni_mtx_lock(&listeners_lk);
	if ((l = nni_id_get(&listeners, id)) != NULL) {
		l->l_ref++;
		*lp = l;
	}
	nni_mtx_unlock(&listeners_lk);
	return (l == NULL ? NNG_ENOENT : 0);
}